

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaComparePreserveReplaceStrings(xmlChar *x,xmlChar *y,int invert)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0;
  do {
    bVar1 = x[lVar3];
    bVar2 = y[lVar3];
    if (bVar1 == 0) {
      if (bVar2 == 0) {
        return 0;
      }
LAB_001a8cad:
      bVar4 = invert == 0;
LAB_001a8cb8:
      return -(uint)bVar4 | 1;
    }
    if ((1 < bVar2 - 9) && (bVar2 != 0xd)) {
      if (bVar2 != 0) {
        if (bVar1 < bVar2) goto LAB_001a8cad;
        if (bVar1 == bVar2) goto LAB_001a8c9e;
      }
LAB_001a8cb4:
      bVar4 = invert != 0;
      goto LAB_001a8cb8;
    }
    if (bVar1 != 0x20) {
      if (0x1f < bVar1) goto LAB_001a8cb4;
      goto LAB_001a8cad;
    }
LAB_001a8c9e:
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int
xmlSchemaComparePreserveReplaceStrings(const xmlChar *x,
				       const xmlChar *y,
				       int invert)
{
    int tmp;

    while ((*x != 0) && (*y != 0)) {
	if (IS_WSP_REPLACE_CH(*y)) {
	    if (! IS_WSP_SPACE_CH(*x)) {
		if ((*x - 0x20) < 0) {
		    if (invert)
			return(1);
		    else
			return(-1);
		} else {
		    if (invert)
			return(-1);
		    else
			return(1);
		}
	    }
	} else {
	    tmp = *x - *y;
	    if (tmp < 0) {
		if (invert)
		    return(1);
		else
		    return(-1);
	    }
	    if (tmp > 0) {
		if (invert)
		    return(-1);
		else
		    return(1);
	    }
	}
	x++;
	y++;
    }
    if (*x != 0) {
	if (invert)
	    return(-1);
	else
	    return(1);
    }
    if (*y != 0) {
	if (invert)
	    return(1);
	else
	    return(-1);
    }
    return(0);
}